

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.cpp
# Opt level: O1

void * SBGThread(void *pParam)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  time_t tVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  char *__s;
  CHRONO chrono_period;
  tm t;
  char szTemp [256];
  SBGDATA sbgdata;
  char szSaveFilePath [256];
  SBG sbg;
  double local_2c38;
  double local_2c30;
  interval local_2c28;
  int local_2c10;
  int local_2c0c;
  interval local_2c08;
  uint local_2bf0;
  uint local_2bec;
  timeval local_2be8;
  interval local_2bd0;
  timespec local_2bb8;
  double local_2ba8;
  double dStack_2ba0;
  double local_2b98;
  double dStack_2b90;
  timespec local_2b88;
  int local_2b78;
  double local_2b70;
  double local_2b68;
  double local_2b60;
  tm local_2b58;
  char local_2b18 [256];
  SBGDATA local_2a18;
  char local_1868 [264];
  SBG local_1760;
  
  memset(&local_1760,0,0x1730);
  local_2be8.tv_sec = 0;
  local_2be8.tv_usec = 0;
  memset(&local_2a18,0,0x11b0);
  GNSSqualitySBG = 0;
  iVar4 = clock_getres(4,&local_2b88);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_2bb8), iVar4 == 0)) {
    local_2b78 = 0;
    local_2ba8 = 0.0;
    dStack_2ba0 = 0.0;
    local_2b98 = 0.0;
    dStack_2b90 = 0.0;
  }
  local_2c10 = 0x32;
  __s = "SBG disconnection failed.";
  bVar2 = false;
  local_2c0c = 0;
  do {
    while( true ) {
      if (local_2b78 == 0) {
        clock_gettime(4,(timespec *)&local_2c28);
        local_2ba8 = local_2c28.inf;
        dStack_2ba0 = local_2c28.sup;
        local_2c28.inf =
             (double)(((long)local_2c28.inf + (long)local_2b98 +
                      ((long)local_2c28.sup + (long)dStack_2b90) / 1000000000) - local_2bb8.tv_sec);
        local_2c28.sup =
             (double)(((long)local_2c28.sup + (long)dStack_2b90) % 1000000000 - local_2bb8.tv_nsec);
        if ((long)local_2c28.sup < 0) {
          local_2c28.inf = (double)((long)local_2c28.inf + (long)local_2c28.sup / 1000000000 + -1);
          local_2c28.sup = (double)((long)local_2c28.sup % 1000000000 + 1000000000);
        }
        local_2b98 = local_2c28.inf;
        dStack_2b90 = local_2c28.sup;
      }
      iVar4 = clock_getres(4,&local_2b88);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_2bb8), iVar4 == 0)) {
        local_2b78 = 0;
        local_2b98 = 0.0;
        dStack_2b90 = 0.0;
        local_2ba8 = 0.0;
        dStack_2ba0 = 0.0;
      }
      if (bPauseSBG == 0) break;
      if (bVar2) {
        puts("SBG paused.");
        GNSSqualitySBG = 0;
        iVar4 = CloseRS232Port(&local_1760.RS232Port);
        pcVar13 = "SBG disconnection failed.";
        if (iVar4 == 0) {
          pcVar13 = "SBG disconnected.";
        }
        puts(pcVar13);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001a51e5;
      }
      local_2c28.inf = 0.0;
      local_2c28.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_2c28,(timespec *)0x0);
    }
    if (bRestartSBG != 0) {
      if (bVar2) {
        puts("Restarting a SBG.");
        GNSSqualitySBG = 0;
        iVar4 = CloseRS232Port(&local_1760.RS232Port);
        pcVar13 = "SBG disconnection failed.";
        if (iVar4 == 0) {
          pcVar13 = "SBG disconnected.";
        }
        puts(pcVar13);
      }
      bRestartSBG = 0;
      bVar2 = false;
    }
    if (bVar2) {
      iVar4 = GetFrameSBG(&local_1760,&local_2a18);
      if (iVar4 == 0) {
        iVar4 = gettimeofday(&local_2be8,(__timezone_ptr_t)0x0);
        if (iVar4 != 0) {
          local_2be8.tv_sec = 0;
          local_2be8.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar1 = fmod(local_2a18.Roll,6.283185307179586);
        local_2c38 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_2c38 = local_2c38 + -3.141592653589793;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -phi_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&phi_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&phi_ahrs,&local_2c28);
        interval::interval(&local_2c08,&local_2a18.gyrX);
        local_2c38 = -omegax_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c38,&omegax_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&omegax_ahrs,&local_2c28);
        dVar1 = fmod(-local_2a18.Pitch,6.283185307179586);
        local_2c38 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_2c38 = local_2c38 + -3.141592653589793;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -theta_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&theta_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&theta_ahrs,&local_2c28);
        local_2c38 = -local_2a18.gyrY;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -omegay_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&omegay_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&omegay_ahrs,&local_2c28);
        dVar1 = fmod((1.5707963267948966 - local_2a18.Yaw) - angle_env,6.283185307179586);
        local_2c38 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_2c38 = local_2c38 + -3.141592653589793;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -psi_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&psi_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&psi_ahrs,&local_2c28);
        local_2c38 = -local_2a18.gyrZ;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -omegaz_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&omegaz_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&omegaz_ahrs,&local_2c28);
        interval::interval(&local_2c08,&local_2a18.accX);
        local_2c38 = -accrx_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c38,&accrx_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&accrx_ahrs,&local_2c28);
        local_2c38 = -local_2a18.accY;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -accry_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&accry_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&accry_ahrs,&local_2c28);
        local_2c38 = -local_2a18.accZ;
        interval::interval(&local_2c08,&local_2c38);
        local_2c30 = -accrz_ahrs_acc;
        interval::interval(&local_2bd0,&local_2c30,&accrz_ahrs_acc);
        operator+(&local_2c08,&local_2bd0);
        interval::operator=((interval *)&accrz_ahrs,&local_2c28);
        if ((((local_2a18.positionStdDev[0] <= 0.0) ||
             (local_1760.gpsaccuracythreshold / 3.0 <= (double)local_2a18.positionStdDev[0])) ||
            (local_2a18.positionStdDev[1] <= 0.0)) ||
           (local_1760.gpsaccuracythreshold / 3.0 <= (double)local_2a18.positionStdDev[1])) {
          GNSSqualitySBG = 0;
        }
        else {
          GNSSqualitySBG = 1;
          ComputeGNSSPosition(local_2a18.Lat,local_2a18.Long,local_2a18.Alt,1,0,0.0);
          local_2b58.tm_wday = 0;
          local_2b58.tm_yday = 0;
          local_2b58.tm_gmtoff = 0;
          local_2b58.tm_zone = (char *)0x0;
          local_2b58.tm_year = local_2a18.UTCTime.Year - 0x76c;
          local_2b58.tm_mon = local_2a18.UTCTime.Month - 1;
          local_2b58.tm_mday._0_1_ = local_2a18.UTCTime.Day;
          local_2b58.tm_hour = (uint)local_2a18.UTCTime.Hour;
          local_2b58.tm_mday._1_3_ = 0;
          local_2b58.tm_min._0_1_ = local_2a18.UTCTime.Minute;
          local_2b58.tm_sec = (uint)local_2a18.UTCTime.Seconds;
          local_2b58.tm_min._1_3_ = 0;
          local_2b58.tm_isdst = 0;
          local_2b58._36_4_ = 0;
          tVar6 = timegm(&local_2b58);
          utc = (double)tVar6 * 1000.0 + (double)local_2a18.UTCTime.Nanoseconds / 1000000.0;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        if (local_1760.bSaveRawData == 0) {
LAB_001a51da:
          bVar2 = true;
          bVar3 = false;
        }
        else {
          local_2bec = local_2a18.UTCTime.Nanoseconds;
          local_2bf0 = (uint)local_2a18.UTCTime.Year;
          local_2b60 = (double)local_2a18.UTCTime.Seconds;
          local_2b68 = local_2a18.accX;
          local_2b70 = local_2a18.accY;
          bVar3 = false;
          fprintf((FILE *)local_1760.pfSaveFile,
                  "%d;%d;%d;%d;%d;%d;%d;%d;%f;%d;%d;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.8f;%.8f;%f;%f;%f;%f;%d;%d;%f;%f;%f;%f;\n"
                  ,SUB84(local_2b60,0),SUB84(local_2a18.accX,0),local_2a18.accY,local_2a18.accZ,
                  local_2a18.gyrX,local_2a18.gyrY,local_2a18.gyrZ,local_2a18.magX,
                  (ulong)local_2a18.TS,0,(ulong)local_2a18.UTCTime.Nanoseconds,(ulong)local_2bf0,
                  (uint)local_2a18.UTCTime.Month,(uint)local_2a18.UTCTime.Day,
                  (uint)local_2a18.UTCTime.Hour,(uint)local_2a18.UTCTime.Minute,
                  (uint)local_2a18.UTCTime.Valid,(uint)local_2a18.Status,local_2a18.magY,
                  local_2a18.magZ,local_2a18.roll,local_2a18.pitch,local_2a18.yaw,local_2a18.Lat,
                  local_2a18.Long,local_2a18.Alt,local_2a18.Vel_X,local_2a18.Vel_Y,local_2a18.Vel_Z,
                  (undefined4)local_2be8.tv_sec,(undefined4)local_2be8.tv_usec,
                  local_2a18.heave_period,local_2a18.surge,local_2a18.sway,local_2a18.heave);
          fflush((FILE *)local_1760.pfSaveFile);
        }
      }
      else {
        puts("Connection to a SBG lost.");
        GNSSqualitySBG = 0;
        iVar4 = CloseRS232Port(&local_1760.RS232Port);
        pcVar13 = "SBG disconnection failed.";
        if (iVar4 == 0) {
          pcVar13 = "SBG disconnected.";
        }
        puts(pcVar13);
        local_2c28.inf = (double)((long)local_2c10 / 1000);
        local_2c28.sup = (double)(((long)local_2c10 % 1000) * 1000000);
LAB_001a4759:
        bVar2 = false;
        nanosleep((timespec *)&local_2c28,(timespec *)0x0);
        bVar3 = true;
      }
    }
    else {
      iVar4 = ConnectSBG(&local_1760,"SBG0.txt");
      if (iVar4 != 0) {
        GNSSqualitySBG = 0;
        local_2c28.inf = 4.94065645841247e-324;
        local_2c28.sup = 0.0;
        goto LAB_001a4759;
      }
      local_2c10 = local_1760.threadperiod;
      local_2be8.tv_sec = 0;
      local_2be8.tv_usec = 0;
      memset(&local_2a18,0,0x11b0);
      if ((FILE *)local_1760.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_1760.pfSaveFile);
        local_1760.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_1760.bSaveRawData != 0) && ((FILE *)local_1760.pfSaveFile == (FILE *)0x0)) {
        if (local_1760.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_2b18,"sbg",4);
        }
        else {
          sprintf(local_2b18,"%.127s",local_1760.szCfgFilePath);
        }
        sVar7 = strlen(local_2b18);
        uVar5 = (uint)sVar7;
        uVar12 = sVar7 & 0xffffffff;
        uVar8 = (int)uVar5 >> 0x1f & uVar5;
        uVar11 = sVar7 & 0xffffffff;
        do {
          uVar12 = uVar12 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar8 - 1);
          uVar9 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar9 = uVar10;
        } while (local_2b18[uVar12 & 0xffffffff] != '.');
        if ((int)uVar9 <= (int)uVar5 && 1 < (int)uVar9) {
          memset(local_2b18 + uVar11,0,sVar7 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar13 = strtimeex_fns();
        sprintf(local_1868,"log/%.127s_%.64s.csv",local_2b18,pcVar13);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_1760.pfSaveFile = (FILE *)fopen(local_1868,"w");
        if ((FILE *)local_1760.pfSaveFile != (FILE *)0x0) {
          fwrite("PacketCounter;SampleTimeFine;UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;StatusWord;Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);Mag_X;Mag_Y;Mag_Z;Roll (in deg);Pitch (in deg);Yaw (in deg);Latitude (in deg);Longitude (in deg);Altitude (in m);Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);tv_sec;tv_usec;heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
                 ,0x1c0,1,(FILE *)local_1760.pfSaveFile);
          fflush((FILE *)local_1760.pfSaveFile);
          goto LAB_001a51da;
        }
        puts("Unable to create SBG data file.");
        bVar3 = false;
        goto LAB_001a51e5;
      }
    }
    if ((bVar3) &&
       (local_2c0c = local_2c0c + 1, ExitOnErrorCount <= local_2c0c && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001a51e5:
      if (local_2b78 == 0) {
        clock_gettime(4,(timespec *)&local_2c28);
        local_2ba8 = local_2c28.inf;
        dStack_2ba0 = local_2c28.sup;
        local_2c28.inf =
             (double)(((long)local_2c28.inf + (long)local_2b98 +
                      ((long)local_2c28.sup + (long)dStack_2b90) / 1000000000) - local_2bb8.tv_sec);
        local_2c28.sup =
             (double)(((long)local_2c28.sup + (long)dStack_2b90) % 1000000000 - local_2bb8.tv_nsec);
        if ((long)local_2c28.sup < 0) {
          local_2c28.inf = (double)((long)local_2c28.inf + (long)local_2c28.sup / 1000000000 + -1);
          local_2c28.sup = (double)((long)local_2c28.sup % 1000000000 + 1000000000);
        }
        local_2b98 = local_2c28.inf;
        dStack_2b90 = local_2c28.sup;
      }
      GNSSqualitySBG = 0;
      if ((FILE *)local_1760.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_1760.pfSaveFile);
        local_1760.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        iVar4 = CloseRS232Port(&local_1760.RS232Port);
        if (iVar4 == 0) {
          __s = "SBG disconnected.";
        }
        puts(__s);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGThread(void* pParam)
{
	SBG sbg;
	struct timeval tv;
	SBGDATA sbgdata;
	struct tm t;
	time_t tt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&sbg, 0, sizeof(SBG));

	memset(&tv, 0, sizeof(tv));
	memset(&sbgdata, 0, sizeof(sbgdata));

	GNSSqualitySBG = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

#ifdef ENABLE_SBG_SDK_SUPPORT
		mSleep(threadperiod);
#endif // ENABLE_SBG_SDK_SUPPORT

		if (bPauseSBG)
		{
			if (bConnected)
			{
				printf("SBG paused.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSBG)
		{
			if (bConnected)
			{
				printf("Restarting a SBG.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			bRestartSBG = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSBG(&sbg, "SBG0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = sbg.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&sbgdata, 0, sizeof(sbgdata));

				if (sbg.pfSaveFile != NULL)
				{
					fclose(sbg.pfSaveFile); 
					sbg.pfSaveFile = NULL;
				}
				if ((sbg.bSaveRawData)&&(sbg.pfSaveFile == NULL)) 
				{
					if (strlen(sbg.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", sbg.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "sbg");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					sbg.pfSaveFile = fopen(szSaveFilePath, "w");
					if (sbg.pfSaveFile == NULL) 
					{
						printf("Unable to create SBG data file.\n");
						break;
					}
					fprintf(sbg.pfSaveFile, 
						"PacketCounter;SampleTimeFine;"
						"UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;"
						"StatusWord;"
						"Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);"
						"Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);"
						"Mag_X;Mag_Y;Mag_Z;"
						"Roll (in deg);Pitch (in deg);Yaw (in deg);"
						"Latitude (in deg);Longitude (in deg);Altitude (in m);"
						"Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);"
						"tv_sec;tv_usec;"
						"heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
						); 
					fflush(sbg.pfSaveFile);
				}
			}
			else 
			{
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
#ifdef ENABLE_SBG_SDK_SUPPORT
			if (GetLatestDataSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#else
			if (GetFrameSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#endif // ENABLE_SBG_SDK_SUPPORT
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(sbgdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				omegax_ahrs = sbgdata.gyrX+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
				theta_ahrs = fmod_2PI(-sbgdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				omegay_ahrs = -sbgdata.gyrY+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-sbgdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				omegaz_ahrs = -sbgdata.gyrZ+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
				accrx_ahrs = sbgdata.accX+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
				accry_ahrs = -sbgdata.accY+interval(-accry_ahrs_acc, accry_ahrs_acc);
				accrz_ahrs = -sbgdata.accZ+interval(-accrz_ahrs_acc, accrz_ahrs_acc);

				// Check accuracy at 3*sigma to use GPS data.
				if ((sbgdata.positionStdDev[0] > 0)&&(sbgdata.positionStdDev[0] < sbg.gpsaccuracythreshold/3.0)&&
					(sbgdata.positionStdDev[1] > 0)&&(sbgdata.positionStdDev[1] < sbg.gpsaccuracythreshold/3.0))
				{
					GNSSqualitySBG = AUTONOMOUS_GNSS_FIX;
					ComputeGNSSPosition(sbgdata.Lat, sbgdata.Long, sbgdata.Alt, GNSSqualitySBG, 0, 0);
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = sbgdata.UTCTime.Year-1900; t.tm_mon = sbgdata.UTCTime.Month-1; t.tm_mday = sbgdata.UTCTime.Day; 
					t.tm_hour = sbgdata.UTCTime.Hour; t.tm_min = sbgdata.UTCTime.Minute; t.tm_sec = sbgdata.UTCTime.Seconds; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+sbgdata.UTCTime.Nanoseconds/1000000.0;
				}
				else
				{
					GNSSqualitySBG = GNSS_NO_FIX;
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (sbg.bSaveRawData)
				{
					fprintf(sbg.pfSaveFile, 
						"%d;%d;"
						"%d;%d;%d;%d;%d;%d;%f;%d;"
						"%d;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%.8f;%.8f;%f;"
						"%f;%f;%f;"
						"%d;%d;"
						"%f;%f;%f;%f;\n", 
						(int)sbgdata.TS, (int)0, 
						(int)sbgdata.UTCTime.Nanoseconds, (int)sbgdata.UTCTime.Year, (int)sbgdata.UTCTime.Month, (int)sbgdata.UTCTime.Day, (int)sbgdata.UTCTime.Hour, (int)sbgdata.UTCTime.Minute, (double)sbgdata.UTCTime.Seconds, (int)sbgdata.UTCTime.Valid, 
						(int)sbgdata.Status, 
						sbgdata.accX, sbgdata.accY, sbgdata.accZ, 
						sbgdata.gyrX, sbgdata.gyrY, sbgdata.gyrZ, 
						sbgdata.magX, sbgdata.magY, sbgdata.magZ, 
						sbgdata.roll, sbgdata.pitch, sbgdata.yaw, 
						sbgdata.Lat, sbgdata.Long, sbgdata.Alt, 
						sbgdata.Vel_X, sbgdata.Vel_Y, sbgdata.Vel_Z, 
						(int)tv.tv_sec, (int)tv.tv_usec, 
						sbgdata.heave_period, sbgdata.surge, sbgdata.sway, sbgdata.heave
						);
					fflush(sbg.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a SBG lost.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
#ifndef ENABLE_SBG_SDK_SUPPORT
				mSleep(threadperiod);
#endif // !ENABLE_SBG_SDK_SUPPORT
			}
		}

		//printf("SBGThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}